

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LeakReport.cpp
# Opt level: O1

void Memory::LeakReport::StartRedirectOutput(void)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  bVar2 = EnsureLeakReportFile();
  if (bVar2) {
    CCLock::Enter(&s_cs.super_CCLock);
    if (nestedRedirectOutputCount == 0) {
      if (oldFile != (PAL_FILE *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LeakReport.cpp"
                           ,0x2b,"(oldFile == nullptr)","oldFile == nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      oldFile = Output::SetFile((PAL_FILE *)file.super_BasePtr<_PAL_FILE>.ptr);
    }
    nestedRedirectOutputCount = nestedRedirectOutputCount + 1;
  }
  return;
}

Assistant:

void
LeakReport::StartRedirectOutput()
{
    if (!EnsureLeakReportFile())
    {
        return;
    }
    s_cs.Enter();
    if (nestedRedirectOutputCount == 0)
    {
        Assert(oldFile == nullptr);
        oldFile = Output::SetFile(file);
    }
    nestedRedirectOutputCount++;
}